

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O1

char __thiscall Potassco::BufferedStream::get(BufferedStream *this)

{
  size_t sVar1;
  char cVar2;
  
  sVar1 = this->rpos_;
  cVar2 = this->buf_[sVar1];
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    this->rpos_ = sVar1 + 1;
    if (this->buf_[sVar1 + 1] == '\0') {
      underflow(this,true);
    }
    if (cVar2 == '\r') {
      sVar1 = this->rpos_;
      cVar2 = '\n';
      if ((this->buf_[sVar1] == '\n') && (this->rpos_ = sVar1 + 1, this->buf_[sVar1 + 1] == '\0')) {
        underflow(this,true);
      }
    }
    if (cVar2 == '\n') {
      this->line_ = this->line_ + 1;
    }
  }
  return cVar2;
}

Assistant:

void AbstractProgram::theoryAtom(Id_t, Id_t, const IdSpan&) { throw std::logic_error("theory data not supported"); }